

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

void __thiscall CPU::BRK_IP(CPU *this)

{
  uint16_t uVar1;
  
  this->cycles = 7;
  WriteWordToStack(this,this->pc);
  WriteByteToStack(this,(this->field_6).ps);
  uVar1 = ReadWord(this,0xfffe);
  this->pc = uVar1;
  this->cycles = this->cycles - 1;
  (this->field_6).ps = (this->field_6).ps | 0x20;
  return;
}

Assistant:

void CPU::BRK_IP()
{
    cycles = 7;
    WriteWordToStack(pc);
    WriteByteToStack(ps);
    pc = ReadWord(0xFFFE);
    cycles--;
    B = 1;
}